

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O1

void __thiscall maxNodeHeap::insert(maxNodeHeap *this,NodeID node,Gain gain)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *pmVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  int pos;
  int iVar7;
  NodeID local_54;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  QElement<maxNodeHeap::Data> local_48;
  
  uVar1 = (this->m_element_index)._M_h._M_bucket_count;
  uVar4 = (ulong)(long)node % uVar1;
  p_Var5 = (this->m_element_index)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(int *)&p_Var5->_M_nxt[1]._M_nxt != node)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, *(int *)&p_Var2[1]._M_nxt == node)) goto LAB_00122576;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00122576:
  if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
    local_50 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->m_element_index;
    iVar7 = (int)((ulong)((long)(this->m_elements).
                                super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_elements).
                               super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    local_48._vptr_QElement = (_func_int **)&PTR__QElement_0012ed50;
    pos = (int)((ulong)((long)(this->m_heap).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_heap).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_54 = node;
    local_48.m_data.node = node;
    local_48.m_key = gain;
    local_48.m_index = pos;
    std::vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>>::
    emplace_back<QElement<maxNodeHeap::Data>>
              ((vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>> *)
               &this->m_elements,&local_48);
    local_48._vptr_QElement = (_func_int **)CONCAT44(iVar7,gain);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_heap,
               (pair<int,_int> *)&local_48);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_50,&local_54);
    *pmVar3 = iVar7;
    siftUp(this,pos);
  }
  return;
}

Assistant:

inline void maxNodeHeap::insert(NodeID node, Gain gain) {
        if( m_element_index.find(node) == m_element_index.end() ) {
                int element_index =  m_elements.size();
                int heap_size     =  m_heap.size();

                m_elements.push_back( PQElement( Data(node), gain, heap_size) );
                m_heap.push_back( std::pair< Key, int>(gain, element_index) );
                m_element_index[node] = element_index;
                siftUp( heap_size );
        }
}